

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

string * __thiscall
TgBot::TgTypeParser::parseMessageEntity_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  string *psVar1;
  allocator local_59;
  string local_58;
  string local_38;
  
  if ((object->super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_58);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    psVar1 = &local_58;
    std::__cxx11::string::string((string *)psVar1,"type",(allocator *)&local_38);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->type);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"offset",(allocator *)&local_38);
    appendToJson<int>(this,__return_storage_ptr__,&local_58,
                      &((object->
                        super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                       )->offset);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"length",(allocator *)&local_38);
    appendToJson<int>(this,__return_storage_ptr__,&local_58,
                      &((object->
                        super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                       )->length);
    std::__cxx11::string::~string((string *)&local_58);
    psVar1 = &local_58;
    std::__cxx11::string::string((string *)psVar1,"url",(allocator *)&local_38);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->url);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"user",&local_59);
    psVar1 = &local_38;
    parseUser_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->user);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    removeLastComma(this,__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseMessageEntity(const MessageEntity::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "type", object->type);
    appendToJson(result, "offset", object->offset);
    appendToJson(result, "length", object->length);
    appendToJson(result, "url", object->url);
    appendToJson(result, "user", parseUser(object->user));
    removeLastComma(result);
    result += '}';
    return result;
}